

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_sock_packet_rotate_unsafe(uintptr_t fd)

{
  short *psVar1;
  fio_packet_s *packet_00;
  fio_packet_s *packet;
  uintptr_t fd_local;
  
  packet_00 = *(fio_packet_s **)((long)fio_data + fd * 0xa8 + 0x40);
  *(fio_packet_s **)((long)fio_data + fd * 0xa8 + 0x40) = packet_00->next;
  LOCK();
  psVar1 = (short *)((long)fio_data + fd * 0xa8 + 0x68);
  *psVar1 = *psVar1 + -1;
  UNLOCK();
  if (packet_00->next == (fio_packet_s *)0x0) {
    *(uintptr_t *)((long)fio_data + fd * 0xa8 + 0x48) = (long)fio_data + fd * 0xa8 + 0x40;
    *(undefined2 *)((long)fio_data + fd * 0xa8 + 0x68) = 0;
  }
  else if (packet_00 == *(fio_packet_s **)((long)fio_data + fd * 0xa8 + 0x48)) {
    *(uintptr_t *)((long)fio_data + fd * 0xa8 + 0x48) = (long)fio_data + fd * 0xa8 + 0x40;
  }
  fio_packet_free(packet_00);
  return;
}

Assistant:

static inline void fio_sock_packet_rotate_unsafe(uintptr_t fd) {
  fio_packet_s *packet = fd_data(fd).packet;
  fd_data(fd).packet = packet->next;
  fio_atomic_sub(&fd_data(fd).packet_count, 1);
  if (!packet->next) {
    fd_data(fd).packet_last = &fd_data(fd).packet;
    fd_data(fd).packet_count = 0;
  } else if (&packet->next == fd_data(fd).packet_last) {
    fd_data(fd).packet_last = &fd_data(fd).packet;
  }
  fio_packet_free(packet);
}